

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall
CConnman::Bind(CConnman *this,CService *addr_,uint flags,NetPermissionFlags permissions)

{
  long lVar1;
  CClientUIInterface *this_00;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  allocator<char> local_b1;
  string local_b0;
  bilingual_str strError;
  CService addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeFlipIPv6toCJDNS(&addr,addr_);
  strError.original._M_dataplus._M_p = (pointer)&strError.original.field_2;
  strError.original._M_string_length = 0;
  strError.original.field_2._M_local_buf[0] = '\0';
  strError.translated._M_dataplus._M_p = (pointer)&strError.translated.field_2;
  strError.translated._M_string_length = 0;
  strError.translated.field_2._M_local_buf[0] = '\0';
  bVar2 = BindListenPort(this,&addr,&strError,permissions);
  if (bVar2) {
    bVar3 = CNetAddr::IsRoutable(&addr.super_CNetAddr);
    if ((((bVar3) && ((~permissions & 0x50) != 0)) && ((flags & 2) == 0)) && (fDiscover != false)) {
      AddLocal(&addr,2);
    }
  }
  else if (((flags & 1) != 0) &&
          (this_00 = this->m_client_interface, this_00 != (CClientUIInterface *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    CClientUIInterface::ThreadSafeMessageBox(this_00,&strError,&local_b0,0x10000402);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  bilingual_str::~bilingual_str(&strError);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::Bind(const CService& addr_, unsigned int flags, NetPermissionFlags permissions)
{
    const CService addr{MaybeFlipIPv6toCJDNS(addr_)};

    bilingual_str strError;
    if (!BindListenPort(addr, strError, permissions)) {
        if ((flags & BF_REPORT_ERROR) && m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(strError, "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }

    if (addr.IsRoutable() && fDiscover && !(flags & BF_DONT_ADVERTISE) && !NetPermissions::HasFlag(permissions, NetPermissionFlags::NoBan)) {
        AddLocal(addr, LOCAL_BIND);
    }

    return true;
}